

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zoombox.c
# Opt level: O1

void zoombox(tgestate_t *state)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  zxspectrum_t *pzVar5;
  uint uVar6;
  attribute_t aVar7;
  uint8_t uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  char cVar12;
  uint8_t *puVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  int local_40;
  
  (state->zoombox).x = '\f';
  (state->zoombox).y = '\b';
  aVar7 = choose_game_window_attributes(state);
  (state->speccy->screen).attributes[(long)state->width * 9 + 0x12] = aVar7;
  (state->speccy->screen).attributes[(long)state->width * 9 + 0x13] = aVar7;
  (state->speccy->screen).attributes[(long)state->width * 10 + 0x12] = aVar7;
  (state->speccy->screen).attributes[(long)state->width * 10 + 0x13] = aVar7;
  (state->zoombox).width = '\0';
  (state->zoombox).height = '\0';
  do {
    (*state->speccy->stamp)(state->speccy);
    uVar8 = (state->zoombox).x;
    if (uVar8 != '\x01') {
      uVar8 = uVar8 + 0xff;
      (state->zoombox).x = uVar8;
      puVar17 = &(state->zoombox).width;
      *puVar17 = *puVar17 + '\x01';
    }
    uVar1 = (state->zoombox).width;
    if ((byte)(uVar8 + uVar1) < 0x16) {
      (state->zoombox).width = uVar1 + '\x01';
    }
    uVar8 = (state->zoombox).y;
    if (uVar8 != '\x01') {
      uVar8 = uVar8 + 0xff;
      (state->zoombox).y = uVar8;
      puVar17 = &(state->zoombox).height;
      *puVar17 = *puVar17 + '\x01';
    }
    uVar1 = (state->zoombox).height;
    if ((byte)(uVar8 + uVar1) < 0xf) {
      (state->zoombox).height = uVar1 + '\x01';
    }
    local_40 = (int)state->speccy + 0x30;
    bVar2 = (state->zoombox).y;
    bVar3 = (state->zoombox).x;
    puVar17 = state->window_buf +
              (ulong)((int)state->window_buf_stride * (uint)bVar2 + (uint)bVar3 & 0xffff) + 1;
    puVar18 = (state->speccy->screen).pixels +
              (ulong)bVar3 + (ulong)game_window_start_offsets[(ulong)bVar2 * 8];
    bVar2 = (state->zoombox).width;
    iVar9 = state->columns;
    uVar8 = (state->zoombox).height;
    do {
      cVar12 = -8;
      puVar13 = puVar18;
      do {
        uVar11 = (ulong)(state->zoombox).width;
        memcpy(puVar13,puVar17,uVar11);
        puVar17 = puVar17 + uVar11 + (byte)((char)iVar9 - bVar2);
        uVar4 = state->width;
        puVar13 = puVar13 + (long)(int)uVar4 * 8 + (uVar11 - bVar2);
        cVar12 = cVar12 + '\x01';
      } while (cVar12 != '\0');
      uVar6 = uVar4 + 0x700;
      if ((~((int)puVar18 - local_40) & 0xe0U) != 0) {
        uVar6 = uVar4;
      }
      puVar18 = puVar18 + ((ulong)uVar6 & 0xffff);
      uVar8 = uVar8 + 0xff;
    } while (uVar8 != '\0');
    pzVar5 = state->speccy;
    iVar9 = (int)pzVar5 + 0x30;
    lVar10 = (ulong)*(ushort *)("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) + 0x30;
    uVar11 = (ulong)(state->zoombox).x;
    puVar13 = (pzVar5->screen).pixels + uVar11 + lVar10 + -0x31;
    puVar17 = (pzVar5->screen).pixels + uVar11 + lVar10 + -0x30;
    puVar18 = (pzVar5->screen).pixels +
              *(ushort *)("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) + uVar11 +
              -0x30;
    lVar10 = 0x101 - (long)puVar18;
    lVar15 = 0;
    do {
      *puVar13 = (&zoombox_draw_tile_zoombox_tiles)[lVar15];
      puVar13 = puVar13 + 0x100;
      lVar15 = lVar15 + 1;
      lVar10 = lVar10 + -0x100;
    } while ((char)lVar15 != '\b');
    uVar11 = -(lVar10 + (long)state->speccy);
    lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
    if ((long)uVar11 < 0x800) {
      lVar10 = 0;
    }
    (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
    uVar8 = (state->zoombox).width;
    lVar10 = 0x100 - (long)puVar18;
    do {
      lVar15 = lVar10;
      lVar10 = 0;
      lVar16 = 0;
      do {
        puVar17[lVar10] = (&DAT_0010fa88)[lVar16];
        lVar16 = lVar16 + 1;
        lVar10 = lVar10 + 0x100;
      } while ((char)lVar16 != '\b');
      puVar17 = puVar17 + 1;
      uVar11 = (lVar10 - (long)state->speccy) - lVar15;
      lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
      if ((long)uVar11 < 0x800) {
        lVar10 = 0;
      }
      (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
      uVar8 = uVar8 + 0xff;
      lVar10 = lVar15 + -1;
    } while (uVar8 != '\0');
    lVar10 = 0;
    lVar16 = 0;
    do {
      puVar17[lVar10] = (&DAT_0010fa90)[lVar16];
      lVar16 = lVar16 + 1;
      lVar10 = lVar10 + 0x100;
    } while ((char)lVar16 != '\b');
    uVar11 = lVar10 - (long)((state->speccy->screen).pixels + lVar15 + -0x31);
    lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
    if ((long)uVar11 < 0x800) {
      lVar10 = 0;
    }
    (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
    iVar14 = state->width + 0x700;
    if ((~((int)puVar17 - iVar9) & 0xe0U) != 0) {
      iVar14 = state->width;
    }
    uVar8 = (state->zoombox).height;
    puVar17 = puVar17 + iVar14;
    do {
      puVar18 = puVar17;
      lVar10 = 0x130 - (long)puVar18;
      lVar15 = 0;
      puVar17 = puVar18;
      do {
        *puVar17 = (&DAT_0010fa98)[lVar15];
        puVar17 = puVar17 + 0x100;
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + -0x100;
      } while ((char)lVar15 != '\b');
      uVar11 = -(lVar10 + (long)state->speccy);
      lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
      if ((long)uVar11 < 0x800) {
        lVar10 = 0;
      }
      (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
      iVar14 = state->width + 0x700;
      if ((~((int)puVar18 - iVar9) & 0xe0U) != 0) {
        iVar14 = state->width;
      }
      puVar17 = puVar18 + iVar14;
      uVar8 = uVar8 + 0xff;
    } while (uVar8 != '\0');
    lVar10 = 0x130 - (long)(puVar18 + iVar14);
    lVar15 = 0;
    puVar13 = puVar17;
    do {
      *puVar13 = (&DAT_0010faa0)[lVar15];
      puVar13 = puVar13 + 0x100;
      lVar15 = lVar15 + 1;
      lVar10 = lVar10 + -0x100;
    } while ((char)lVar15 != '\b');
    puVar17 = puVar17 + -1;
    uVar11 = -(lVar10 + (long)state->speccy);
    lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
    if ((long)uVar11 < 0x800) {
      lVar10 = 0;
    }
    (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
    uVar8 = (state->zoombox).width;
    lVar10 = 0x131 - (long)(puVar18 + iVar14);
    do {
      lVar15 = lVar10;
      lVar10 = 0;
      lVar16 = 0;
      do {
        puVar17[lVar10] = (&DAT_0010fa88)[lVar16];
        lVar16 = lVar16 + 1;
        lVar10 = lVar10 + 0x100;
      } while ((char)lVar16 != '\b');
      puVar17 = puVar17 + -1;
      uVar11 = (lVar10 - (long)state->speccy) - lVar15;
      lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
      if ((long)uVar11 < 0x800) {
        lVar10 = 0;
      }
      (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
      uVar8 = uVar8 + 0xff;
      lVar10 = lVar15 + 1;
    } while (uVar8 != '\0');
    lVar10 = 0;
    lVar16 = 0;
    do {
      puVar17[lVar10] = (&DAT_0010faa8)[lVar16];
      lVar16 = lVar16 + 1;
      lVar10 = lVar10 + 0x100;
    } while ((char)lVar16 != '\b');
    uVar11 = lVar10 - (long)((state->speccy->screen).pixels + lVar15 + -0x2f);
    lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
    if ((long)uVar11 < 0x800) {
      lVar10 = 0;
    }
    (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
    iVar14 = 0;
    if (((int)puVar17 - iVar9 & 0xe0U) == 0) {
      iVar14 = -0x700;
    }
    puVar17 = puVar17 + (iVar14 - state->width);
    uVar8 = (state->zoombox).height;
    do {
      lVar10 = 0x130 - (long)puVar17;
      lVar15 = 0;
      puVar18 = puVar17;
      do {
        *puVar18 = (&DAT_0010fa98)[lVar15];
        puVar18 = puVar18 + 0x100;
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + -0x100;
      } while ((char)lVar15 != '\b');
      uVar11 = -(lVar10 + (long)state->speccy);
      lVar10 = (ulong)(0xfff < (long)uVar11) * 0x100 + 0x100;
      if ((long)uVar11 < 0x800) {
        lVar10 = 0;
      }
      (state->speccy->screen).attributes[lVar10 + (uVar11 & 0xff)] = state->game_window_attribute;
      iVar14 = 0;
      if (((int)puVar17 - iVar9 & 0xe0U) == 0) {
        iVar14 = -0x700;
      }
      puVar17 = puVar17 + (iVar14 - state->width);
      uVar8 = uVar8 + 0xff;
    } while (uVar8 != '\0');
    invalidate_bitmap(state,(state->speccy->screen).pixels +
                            (ulong)(state->zoombox).x +
                            (ulong)*(ushort *)
                                    ("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) +
                            -1,(uint)(state->zoombox).width * 8 + 0x10,
                      (uint)(state->zoombox).height * 8 + 0x10);
    (*state->speccy->sleep)
              (state->speccy,
               (((uint)(state->zoombox).width + (uint)(state->zoombox).height) * 0x1b167) / 0x23);
  } while ((uint)(state->zoombox).width + (uint)(state->zoombox).height < 0x23);
  return;
}

Assistant:

void zoombox(tgestate_t *state)
{
  attribute_t attrs; /* was A */
  uint8_t    *pvar;  /* was HL */
  uint8_t     var;   /* was A */

  assert(state != NULL);

  state->zoombox.x = 12;
  state->zoombox.y = 8;

  attrs = choose_game_window_attributes(state);

  state->speccy->screen.attributes[ 9 * state->width + 18] = attrs;
  state->speccy->screen.attributes[ 9 * state->width + 19] = attrs;
  state->speccy->screen.attributes[10 * state->width + 18] = attrs;
  state->speccy->screen.attributes[10 * state->width + 19] = attrs;

  state->zoombox.width  = 0;
  state->zoombox.height = 0;

  do
  {
    state->speccy->stamp(state->speccy);

    /* Shrink X and grow width until X is 1 */
    pvar = &state->zoombox.x;
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow width until it's 22 */
    pvar++; /* -> &state->width */
    var += *pvar;
    if (var < 22)
      (*pvar)++;

    /* Shrink Y and grow height until Y is 1 */
    pvar++; /* -> &state->zoombox.y */
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow height until it's 15 */
    pvar++; /* -> &state->height */
    var += *pvar;
    if (var < 15)
      (*pvar)++;

    zoombox_fill(state);
    zoombox_draw_border(state);

    /* Conv: Invalidation added over the original game. */
    invalidate_bitmap(state,
                      &state->speccy->screen.pixels[0] + game_window_start_offsets[(state->zoombox.y - 1) * 8] + state->zoombox.x - 1,
                      (state->zoombox.width + 2) * 8,
                      (state->zoombox.height + 2) * 8);

    {
      /* Conv: Timing: The original game slows in proportion to the size of
       * the area being zoomboxed. We simulate that here. */
      int delay = (state->zoombox.height + state->zoombox.width) * 110951 / 35;
      state->speccy->sleep(state->speccy, delay);
    }
  }
  while (state->zoombox.height + state->zoombox.width < 35);
}